

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.cpp
# Opt level: O3

bool isValidChash160(char *chash)

{
  uchar i_1;
  byte bVar1;
  uchar uVar2;
  uchar uVar3;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  uchar j;
  long lVar7;
  bool *pbVar8;
  ulong uVar9;
  uchar i;
  long lVar10;
  uchar *puVar11;
  uint8_t calculatedChecksum [4];
  uint8_t hash160 [20];
  bool checksumBin [32];
  uint8_t hashSHA256 [32];
  bool hash160Bin [128];
  bool checksumedHashBin [160];
  uchar auStack_247 [191];
  bool local_188 [32];
  uint8_t local_168 [5];
  uchar local_163;
  undefined1 local_15b;
  undefined1 local_153;
  undefined1 local_14b;
  bool local_148 [128];
  uchar local_c8 [160];
  
  sVar4 = strlen(chash);
  if (sVar4 == 0x20) {
    puVar11 = auStack_247 + 0x17f;
    lVar10 = 0;
    do {
      pvVar5 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZ234567",(int)chash[lVar10],0x21);
      bVar1 = (char)pvVar5 + 0x20;
      lVar7 = 5;
      do {
        puVar11[lVar7 + -1] = bVar1 & 1;
        bVar1 = bVar1 >> 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      lVar10 = lVar10 + 1;
      puVar11 = puVar11 + 5;
    } while (lVar10 != 0x20);
    uVar6 = 0;
    bVar1 = 0;
    do {
      uVar9 = (ulong)bVar1;
      if (uVar6 == offsets[uVar9]) {
        auStack_247[uVar9 + 0xbf] = auStack_247[uVar6 + 0x17f];
        bVar1 = bVar1 + 1;
      }
      else {
        auStack_247[(uVar6 - uVar9) + 0xff] = auStack_247[uVar6 + 0x17f];
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0xa0);
    lVar10 = 4;
    pbVar8 = (bool *)(auStack_247 + 0xff);
    do {
      uVar2 = binArrayToByte(pbVar8);
      auStack_247[lVar10 + 0x9f] = uVar2;
      lVar10 = lVar10 + 1;
      pbVar8 = pbVar8 + 8;
    } while (lVar10 != 0x14);
    getSHA256(auStack_247 + 0xdf,(char *)(auStack_247 + 0xa3),0x10,0x20);
    auStack_247[0x9c] = local_15b;
    auStack_247[0x9d] = local_153;
    auStack_247[0x9e] = local_14b;
    uVar2 = binArrayToByte((bool *)(auStack_247 + 0xbf));
    if (local_163 == uVar2) {
      pbVar8 = (bool *)(auStack_247 + 199);
      uVar6 = 0;
      do {
        uVar9 = uVar6;
        if (uVar9 == 3) break;
        uVar2 = auStack_247[uVar9 + 0x9c];
        uVar3 = binArrayToByte(pbVar8);
        pbVar8 = pbVar8 + 8;
        uVar6 = uVar9 + 1;
      } while (uVar2 == uVar3);
      return 2 < uVar9;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"chash is not 32 length",0x16);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool isValidChash160(const char *chash) {

    if (strlen(chash) != 32) {
#ifdef DEBUG_PRINT
        std::clog << "chash is not 32 length" << std::endl;
#endif
        return false;
    }

    bool checksumBin[32];
    bool checksumedHashBin[160];
    bool hash160Bin[128];

    //convert base32 to bin
    char *pch;
    unsigned char value = 0;
    for (unsigned char i = 0; i < 32; i++) {
        pch = (char *) strchr(base32Chars, chash[i]);
        value = pch - base32Chars;
        for (unsigned char j = 5; j > 0; j--) {
            checksumedHashBin[i * 5 + j - 1] = value & 1;
            value /= 2;
        }
    }

    //unmix data
    unsigned char indexOffset = 0;
    for (unsigned char i = 0; i < 160; i++) {
        if (i == offsets[indexOffset]) {
            checksumBin[indexOffset] = checksumedHashBin[i];
            indexOffset++;

        } else {
            hash160Bin[i - indexOffset] = checksumedHashBin[i];
        }
    }

    uint8_t hash160[20];
    //convert bin to byte
    for (int i = 0; i < 16; i++) {
        hash160[i + 4] = binArrayToByte(&hash160Bin[i * 8]);
    }

    uint8_t calculatedChecksum[4];
    getChecksum((char *) hash160, calculatedChecksum);

    //compare checksums
    for (int i = 0; i < 4; i++) {
        if (calculatedChecksum[i] != binArrayToByte(&checksumBin[i * 8]))
            return false;
    }
    return true;
}